

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filenames.cc
# Opt level: O2

string_view __thiscall wabt::GetBasename(wabt *this,string_view filename)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  string_view sVar4;
  undefined1 local_30 [8];
  string_view filename_local;
  
  filename_local.data_ = filename.data_;
  local_30 = (undefined1  [8])this;
  sVar1 = string_view::find_last_of((string_view *)local_30,'/',0xffffffffffffffff);
  sVar2 = string_view::find_last_of((string_view *)local_30,'\\',0xffffffffffffffff);
  if ((sVar2 & sVar1) == 0xffffffffffffffff) {
LAB_00d94478:
    sVar4.size_ = (size_type)filename_local.data_;
    sVar4.data_ = (char *)local_30;
  }
  else {
    if (sVar1 == 0xffffffffffffffff) {
      sVar3 = sVar2;
      if (sVar2 == 0xffffffffffffffff) goto LAB_00d94478;
    }
    else {
      sVar3 = sVar1;
      if ((sVar2 != 0xffffffffffffffff) && (sVar3 = sVar2, sVar2 < sVar1)) {
        sVar3 = sVar1;
      }
    }
    sVar4 = string_view::substr((string_view *)local_30,sVar3 + 1,0xffffffffffffffff);
  }
  return sVar4;
}

Assistant:

string_view GetBasename(string_view filename) {
  size_t last_slash = filename.find_last_of('/');
  size_t last_backslash = filename.find_last_of('\\');
  if (last_slash == string_view::npos && last_backslash == string_view::npos) {
    return filename;
  }

  if (last_slash == string_view::npos) {
    if (last_backslash == string_view::npos) {
      return filename;
    }
    last_slash = last_backslash;
  } else if (last_backslash != string_view::npos) {
    last_slash = std::max(last_slash, last_backslash);
  }

  return filename.substr(last_slash + 1);
}